

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md2.cpp
# Opt level: O1

bool __thiscall FMD2Model::Load(FMD2Model *this,char *path,int lumpnum,char *buffer,int length)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  FTextureID FVar10;
  FTextureID *pFVar11;
  ModelFrame *pMVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  
  (this->super_FDMDModel).header.magic = 0x32504449;
  (this->super_FDMDModel).header.version = 8;
  (this->super_FDMDModel).header.flags = 0;
  (this->super_FDMDModel).info.skinWidth = *(int *)(buffer + 8);
  (this->super_FDMDModel).info.skinHeight = *(int *)(buffer + 0xc);
  iVar2 = *(int *)(buffer + 0x10);
  (this->super_FDMDModel).info.frameSize = iVar2;
  (this->super_FDMDModel).info.numLODs = 1;
  iVar3 = *(int *)(buffer + 0x14);
  (this->super_FDMDModel).info.numSkins = iVar3;
  (this->super_FDMDModel).info.numTexCoords = *(int *)(buffer + 0x1c);
  (this->super_FDMDModel).info.numVertices = *(int *)(buffer + 0x18);
  iVar4 = *(int *)(buffer + 0x28);
  (this->super_FDMDModel).info.numFrames = iVar4;
  (this->super_FDMDModel).info.offsetSkins = *(int *)(buffer + 0x2c);
  (this->super_FDMDModel).info.offsetTexCoords = *(int *)(buffer + 0x30);
  iVar5 = *(int *)(buffer + 0x38);
  (this->super_FDMDModel).info.offsetFrames = iVar5;
  iVar6 = *(int *)(buffer + 0x40);
  (this->super_FDMDModel).info.offsetLODs = iVar6;
  (this->super_FDMDModel).lodInfo[0].numTriangles = *(int *)(buffer + 0x20);
  iVar7 = *(int *)(buffer + 0x24);
  (this->super_FDMDModel).lodInfo[0].numGlCommands = iVar7;
  (this->super_FDMDModel).lodInfo[0].offsetTriangles = *(int *)(buffer + 0x34);
  (this->super_FDMDModel).lodInfo[0].offsetGlCommands = *(int *)(buffer + 0x3c);
  (this->super_FDMDModel).info.offsetEnd = iVar6;
  if (length < iVar4 * iVar2 + iVar5) {
    pcVar14 = "LoadModel: Model \'%s\' file too short\n";
  }
  else {
    if (0 < iVar7) {
      uVar15 = (long)iVar3 << 2;
      if (iVar3 < 0) {
        uVar15 = 0xffffffffffffffff;
      }
      pFVar11 = (FTextureID *)operator_new__(uVar15);
      (this->super_FDMDModel).skins = pFVar11;
      if (0 < (this->super_FDMDModel).info.numSkins) {
        lVar13 = 0;
        pcVar14 = buffer;
        do {
          FVar10 = LoadSkin(path,pcVar14 + (this->super_FDMDModel).info.offsetSkins);
          (this->super_FDMDModel).skins[lVar13].texnum = FVar10.texnum;
          lVar13 = lVar13 + 1;
          pcVar14 = pcVar14 + 0x40;
        } while (lVar13 < (this->super_FDMDModel).info.numSkins);
      }
      uVar16 = (ulong)(this->super_FDMDModel).info.numFrames;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar16;
      iVar2 = (this->super_FDMDModel).info.offsetFrames;
      uVar15 = 0xffffffffffffffff;
      if (SUB168(auVar8 * ZEXT816(0x14),8) == 0) {
        uVar15 = SUB168(auVar8 * ZEXT816(0x14),0);
      }
      pMVar12 = (ModelFrame *)operator_new__(uVar15);
      (this->super_FDMDModel).frames = pMVar12;
      if (0 < (long)uVar16) {
        pcVar14 = buffer + (long)iVar2 + 0x18;
        iVar2 = (this->super_FDMDModel).info.frameSize;
        lVar13 = 0;
        do {
          uVar9 = *(undefined8 *)(pcVar14 + 8);
          *(undefined8 *)(pMVar12->name + lVar13) = *(undefined8 *)pcVar14;
          *(undefined8 *)(pMVar12->name + lVar13 + 8) = uVar9;
          pcVar1 = pMVar12->name + lVar13 + 0x10;
          pcVar1[0] = -1;
          pcVar1[1] = -1;
          pcVar1[2] = -1;
          pcVar1[3] = -1;
          pcVar14 = pcVar14 + iVar2;
          lVar13 = lVar13 + 0x14;
        } while (uVar16 * 0x14 != lVar13);
      }
      (this->super_FDMDModel).mLumpNum = lumpnum;
      return true;
    }
    pcVar14 = "LoadModel: Model \'%s\' invalid NumGLCommands\n";
  }
  Printf(pcVar14,path);
  return false;
}

Assistant:

bool FMD2Model::Load(const char * path, int lumpnum, const char * buffer, int length)
{
	md2_header_t * md2header = (md2_header_t *)buffer;
	ModelFrame *frame;
	byte   *md2_frames;
	int     i;

	// Convert it to DMD.
	header.magic = MD2_MAGIC;
	header.version = 8;
	header.flags = 0;
	info.skinWidth = LittleLong(md2header->skinWidth);
	info.skinHeight = LittleLong(md2header->skinHeight);
	info.frameSize = LittleLong(md2header->frameSize);
	info.numLODs = 1;
	info.numSkins = LittleLong(md2header->numSkins);
	info.numTexCoords = LittleLong(md2header->numTexCoords);
	info.numVertices = LittleLong(md2header->numVertices);
	info.numFrames = LittleLong(md2header->numFrames);
	info.offsetSkins = LittleLong(md2header->offsetSkins);
	info.offsetTexCoords = LittleLong(md2header->offsetTexCoords);
	info.offsetFrames = LittleLong(md2header->offsetFrames);
	info.offsetLODs = LittleLong(md2header->offsetEnd);	// Doesn't exist.
	lodInfo[0].numTriangles = LittleLong(md2header->numTriangles);
	lodInfo[0].numGlCommands = LittleLong(md2header->numGlCommands);
	lodInfo[0].offsetTriangles = LittleLong(md2header->offsetTriangles);
	lodInfo[0].offsetGlCommands = LittleLong(md2header->offsetGlCommands);
	info.offsetEnd = LittleLong(md2header->offsetEnd);

	if (info.offsetFrames + info.frameSize * info.numFrames > length)
	{
		Printf("LoadModel: Model '%s' file too short\n", path);
		return false;
	}
	if (lodInfo[0].numGlCommands <= 0)
	{
		Printf("LoadModel: Model '%s' invalid NumGLCommands\n", path);
		return false;
	}

	skins = new FTextureID[info.numSkins];

	for (i = 0; i < info.numSkins; i++)
	{
		skins[i] = LoadSkin(path, buffer + info.offsetSkins + i * 64);
	}

	// The frames need to be unpacked.
	md2_frames = (byte*)buffer + info.offsetFrames;
	frames = new ModelFrame[info.numFrames];

	for (i = 0, frame = frames; i < info.numFrames; i++, frame++)
	{
		md2_packedFrame_t *pfr = (md2_packedFrame_t *)(md2_frames + info.frameSize * i);

		memcpy(frame->name, pfr->name, sizeof(pfr->name));
		frame->vindex = UINT_MAX;
	}
	mLumpNum = lumpnum;
	return true;
}